

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O0

void __thiscall
Imf_2_5::RgbaOutputFile::ToYca::setFrameBuffer(ToYca *this,Rgba *base,size_t xStride,size_t yStride)

{
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  FrameBuffer fb;
  FrameBuffer *in_stack_00000458;
  OutputFile *in_stack_00000460;
  Slice local_140;
  Slice local_108;
  Slice local_d0;
  Slice local_88;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if (*(long *)(in_RDI + 0x140) == 0) {
    FrameBuffer::FrameBuffer((FrameBuffer *)0x242d2f);
    if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
      Slice::Slice(&local_88,HALF,
                   (char *)(*(long *)(in_RDI + 0x138) + 2 + (long)-*(int *)(in_RDI + 0x34) * 8),8,0,
                   1,1,0.0,false,false);
      FrameBuffer::insert((FrameBuffer *)xStride,(char *)yStride,
                          (Slice *)fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    if ((*(byte *)(in_RDI + 0x31) & 1) != 0) {
      Slice::Slice(&local_d0,HALF,
                   (char *)(*(long *)(in_RDI + 0x138) + (long)-*(int *)(in_RDI + 0x34) * 8),0x10,0,2
                   ,2,0.0,false,false);
      FrameBuffer::insert((FrameBuffer *)xStride,(char *)yStride,
                          (Slice *)fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Slice::Slice(&local_108,HALF,
                   (char *)(*(long *)(in_RDI + 0x138) + 4 + (long)-*(int *)(in_RDI + 0x34) * 8),0x10
                   ,0,2,2,0.0,false,false);
      FrameBuffer::insert((FrameBuffer *)xStride,(char *)yStride,
                          (Slice *)fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    if ((*(byte *)(in_RDI + 0x32) & 1) != 0) {
      Slice::Slice(&local_140,HALF,
                   (char *)(*(long *)(in_RDI + 0x138) + 6 + (long)-*(int *)(in_RDI + 0x34) * 8),8,0,
                   1,1,0.0,false,false);
      FrameBuffer::insert((FrameBuffer *)xStride,(char *)yStride,
                          (Slice *)fb._map._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    OutputFile::setFrameBuffer(in_stack_00000460,in_stack_00000458);
    FrameBuffer::~FrameBuffer((FrameBuffer *)0x242f6c);
  }
  *(undefined8 *)(in_RDI + 0x140) = local_10;
  *(undefined8 *)(in_RDI + 0x148) = local_18;
  *(undefined8 *)(in_RDI + 0x150) = local_20;
  return;
}

Assistant:

void
RgbaOutputFile::ToYca::setFrameBuffer (const Rgba *base,
				       size_t xStride,
				       size_t yStride)
{
    if (_fbBase == 0)
    {
	FrameBuffer fb;

	if (_writeY)
	{
	    fb.insert ("Y",
		       Slice (HALF,				// type
			      (char *) &_tmpBuf[-_xMin].g,	// base
			      sizeof (Rgba),			// xStride
			      0,				// yStride
			      1,				// xSampling
			      1));				// ySampling
	}

	if (_writeC)
	{
	    fb.insert ("RY",
		       Slice (HALF,				// type
			      (char *) &_tmpBuf[-_xMin].r,	// base
			      sizeof (Rgba) * 2,		// xStride
			      0,				// yStride
			      2,				// xSampling
			      2));				// ySampling

	    fb.insert ("BY",
		       Slice (HALF,				// type
			      (char *) &_tmpBuf[-_xMin].b,	// base
			      sizeof (Rgba) * 2,		// xStride
			      0,				// yStride
			      2,				// xSampling
			      2));				// ySampling
	}

	if (_writeA)
	{
	    fb.insert ("A",
		       Slice (HALF,				// type
			      (char *) &_tmpBuf[-_xMin].a,	// base
			      sizeof (Rgba),			// xStride
			      0,				// yStride
			      1,				// xSampling
			      1));				// ySampling
	}

	_outputFile.setFrameBuffer (fb);
    }

    _fbBase = base;
    _fbXStride = xStride;
    _fbYStride = yStride;
}